

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_ceiling.cpp
# Opt level: O2

bool P_CreateCeiling(sector_t *sec,ECeiling type,line_t *line,int tag,double speed,double speed2,
                    double height,int crush,int silent,int change,ECrushMode hexencrush)

{
  vertex_t *v;
  double *pdVar1;
  ECeiling EVar2;
  bool bVar3;
  bool bVar4;
  DCeiling *this;
  sector_t *psVar5;
  double *pdVar6;
  uint uVar7;
  double dVar8;
  double local_60;
  vertex_t *spot;
  double local_50;
  secplane_t *local_48;
  int local_3c;
  line_t *local_38;
  
  local_50 = speed2;
  local_48 = (secplane_t *)speed;
  bVar3 = sector_t::PlaneMoving(sec,1);
  if (bVar3) goto LAB_0048cc29;
  local_3c = crush;
  this = (DCeiling *)DObject::operator_new(0xa8);
  DCeiling::DCeiling(this,sec,(double)local_48,local_50,silent & 0xfffffffb);
  v = (*sec->lines)->v1;
  spot = v;
  local_38 = line;
  switch(type) {
  case ceilLowerByValue:
    local_60 = secplane_t::ZatPoint(&sec->ceilingplane,v);
    local_60 = local_60 - height;
    goto LAB_0048c96b;
  case ceilRaiseByValue:
    local_60 = secplane_t::ZatPoint(&sec->ceilingplane,v);
    local_60 = height + local_60;
    goto LAB_0048c9a2;
  case ceilMoveToValue:
    local_48 = &sec->ceilingplane;
    local_50 = secplane_t::ZatPoint(local_48,v);
    dVar8 = secplane_t::PointToDist(local_48,v,height);
    if (local_50 <= height) {
      this->m_TopHeight = dVar8;
      this->m_Direction = 1;
    }
    else {
      this->m_BottomHeight = dVar8;
      this->m_Direction = -1;
    }
    bVar4 = height < local_50;
    local_60 = height;
    break;
  case ceilLowerToHighestFloor:
    local_60 = sector_t::FindHighestFloorSurrounding(sec,&spot);
    goto LAB_0048c795;
  case ceilLowerInstant:
    local_50 = secplane_t::ZatPoint(&sec->ceilingplane,v);
    local_50 = local_50 - height;
    dVar8 = secplane_t::PointToDist(&sec->ceilingplane,v,local_50);
    this->m_BottomHeight = dVar8;
    this->m_Direction = -1;
    this->m_Speed = height;
    bVar4 = true;
    local_60 = local_50;
    break;
  case ceilRaiseInstant:
    local_50 = secplane_t::ZatPoint(&sec->ceilingplane,v);
    local_50 = local_50 + height;
    dVar8 = secplane_t::PointToDist(&sec->ceilingplane,v,local_50);
    this->m_TopHeight = dVar8;
    this->m_Direction = 1;
    this->m_Speed = height;
    bVar4 = false;
    local_60 = local_50;
    break;
  case ceilCrushAndRaise:
  case ceilCrushRaiseAndStay:
    this->m_TopHeight = (sec->ceilingplane).D;
  case ceilLowerAndCrush:
  case ceilLowerToFloor:
    local_60 = sector_t::FindHighestFloorPoint(sec,&spot);
LAB_0048c795:
    local_60 = height + local_60;
    goto LAB_0048c9ec;
  default:
    bVar4 = SUB41((uint)this->m_Direction >> 0x1f,0);
    local_60 = 0.0;
    break;
  case ceilRaiseToNearest:
    local_60 = sector_t::FindNextHighestCeiling(sec,&spot);
    goto LAB_0048cad0;
  case ceilLowerToLowest:
    local_60 = sector_t::FindLowestCeilingSurrounding(sec,&spot);
    goto LAB_0048c9ec;
  case ceilRaiseToHighest:
    local_60 = sector_t::FindHighestCeilingSurrounding(sec,&spot);
    goto LAB_0048cad0;
  case ceilLowerToHighest:
    local_60 = sector_t::FindHighestCeilingSurrounding(sec,&spot);
    goto LAB_0048c9ec;
  case ceilRaiseToLowest:
    local_60 = sector_t::FindLowestCeilingSurrounding(sec,&spot);
    goto LAB_0048cad0;
  case ceilLowerToNearest:
    local_60 = sector_t::FindNextLowestCeiling(sec,&spot);
LAB_0048c9ec:
    dVar8 = secplane_t::PointToDist(&sec->ceilingplane,spot,local_60);
LAB_0048c9f4:
    this->m_BottomHeight = dVar8;
    this->m_Direction = -1;
    bVar4 = true;
    break;
  case ceilRaiseToHighestFloor:
    local_60 = sector_t::FindHighestFloorSurrounding(sec,&spot);
    goto LAB_0048cad0;
  case ceilRaiseToFloor:
    local_60 = sector_t::FindHighestFloorPoint(sec,&spot);
    local_60 = height + local_60;
LAB_0048cad0:
    dVar8 = secplane_t::PointToDist(&sec->ceilingplane,spot,local_60);
LAB_0048cad8:
    this->m_TopHeight = dVar8;
    this->m_Direction = 1;
    bVar4 = false;
    break;
  case ceilRaiseByTexture:
    dVar8 = secplane_t::ZatPoint(&sec->ceilingplane,v);
    local_60 = sector_t::FindShortestUpperAround(sec);
    local_60 = local_60 + dVar8;
LAB_0048c9a2:
    dVar8 = secplane_t::PointToDist(&sec->ceilingplane,v,local_60);
    goto LAB_0048cad8;
  case ceilLowerByTexture:
    local_60 = secplane_t::ZatPoint(&sec->ceilingplane,v);
    dVar8 = sector_t::FindShortestUpperAround(sec);
    local_60 = local_60 - dVar8;
LAB_0048c96b:
    dVar8 = secplane_t::PointToDist(&sec->ceilingplane,v,local_60);
    goto LAB_0048c9f4;
  }
  this->m_Tag = tag;
  this->m_Type = type;
  this->m_Crush = local_3c;
  pdVar6 = &this->m_TopHeight;
  pdVar1 = &(sec->ceilingplane).D;
  if (bVar4 != false) {
    pdVar6 = pdVar1;
    pdVar1 = &this->m_BottomHeight;
  }
  this->m_CrushMode = hexencrush;
  if ((*pdVar6 - *pdVar1 <= this->m_Speed) &&
     (DMover::StopInterpolation((DMover *)this,true), (silent & 4U) != 0)) {
    this->m_Silent = 2;
  }
  uVar7 = change & 3;
  if (uVar7 != 0) {
    if ((change & 4U) == 0) {
      if (local_38 != (line_t *)0x0) {
        sec = local_38->frontsector;
        (this->m_Texture).texnum = sec->planes[1].Texture.texnum;
        if (uVar7 == 3) {
LAB_0048cc01:
          EVar2 = genCeilingChg;
        }
        else {
          if (uVar7 != 2) goto LAB_0048cc05;
LAB_0048cbf8:
          sector_t::GetSpecial(sec,&this->m_NewSpecial);
          EVar2 = genCeilingChgT;
        }
LAB_0048cc1c:
        this->m_Type = EVar2;
      }
    }
    else {
      if ((type == ceilRaiseToFloor) || (type == ceilLowerToFloor)) {
        psVar5 = sector_t::FindModelFloorSector(sec,local_60);
      }
      else {
        psVar5 = sector_t::FindModelCeilingSector(sec,local_60);
      }
      if (psVar5 != (sector_t *)0x0) {
        (this->m_Texture).texnum = psVar5->planes[1].Texture.texnum;
        if (uVar7 == 3) goto LAB_0048cc01;
        if (uVar7 == 2) goto LAB_0048cbf8;
LAB_0048cc05:
        (this->m_NewSpecial).damagetype = (FName)0x0;
        (this->m_NewSpecial).damageamount = 0;
        (this->m_NewSpecial).special = 0;
        (this->m_NewSpecial).damageinterval = 0;
        (this->m_NewSpecial).leakydamage = 0;
        *(undefined2 *)&(this->m_NewSpecial).field_0xe = 0;
        (this->m_NewSpecial).Flags = 0;
        EVar2 = genCeilingChg0;
        goto LAB_0048cc1c;
      }
    }
  }
  DCeiling::PlayCeilingSound(this);
LAB_0048cc29:
  return !bVar3;
}

Assistant:

bool P_CreateCeiling(sector_t *sec, DCeiling::ECeiling type, line_t *line, int tag, 
				   double speed, double speed2, double height,
				   int crush, int silent, int change, DCeiling::ECrushMode hexencrush)
{
	double		targheight = 0;	// Silence, GCC

	// if ceiling already moving, don't start a second function on it
	if (sec->PlaneMoving(sector_t::ceiling))
	{
		return false;
	}
	
	// new door thinker
	DCeiling *ceiling = new DCeiling (sec, speed, speed2, silent & ~4);
	vertex_t *spot = sec->lines[0]->v1;

	switch (type)
	{
	case DCeiling::ceilCrushAndRaise:
	case DCeiling::ceilCrushRaiseAndStay:
		ceiling->m_TopHeight = sec->ceilingplane.fD();
	case DCeiling::ceilLowerAndCrush:
		targheight = sec->FindHighestFloorPoint (&spot);
		targheight += height;
		ceiling->m_BottomHeight = sec->ceilingplane.PointToDist (spot, targheight);
		ceiling->m_Direction = -1;
		break;

	case DCeiling::ceilRaiseToHighest:
		targheight = sec->FindHighestCeilingSurrounding (&spot);
		ceiling->m_TopHeight = sec->ceilingplane.PointToDist (spot, targheight);
		ceiling->m_Direction = 1;
		break;

	case DCeiling::ceilLowerByValue:
		targheight = sec->ceilingplane.ZatPoint (spot) - height;
		ceiling->m_BottomHeight = sec->ceilingplane.PointToDist (spot, targheight);
		ceiling->m_Direction = -1;
		break;

	case DCeiling::ceilRaiseByValue:
		targheight = sec->ceilingplane.ZatPoint (spot) + height;
		ceiling->m_TopHeight = sec->ceilingplane.PointToDist (spot, targheight);
		ceiling->m_Direction = 1;
		break;

	case DCeiling::ceilMoveToValue:
		{
			double diff = height - sec->ceilingplane.ZatPoint (spot);

			targheight = height;
			if (diff < 0)
			{
				ceiling->m_BottomHeight = sec->ceilingplane.PointToDist (spot, height);
				ceiling->m_Direction = -1;
			}
			else
			{
				ceiling->m_TopHeight = sec->ceilingplane.PointToDist (spot, height);
				ceiling->m_Direction = 1;
			}
		}
		break;

	case DCeiling::ceilLowerToHighestFloor:
		targheight = sec->FindHighestFloorSurrounding (&spot) + height;
		ceiling->m_BottomHeight = sec->ceilingplane.PointToDist (spot, targheight);
		ceiling->m_Direction = -1;
		break;

	case DCeiling::ceilRaiseToHighestFloor:
		targheight = sec->FindHighestFloorSurrounding (&spot);
		ceiling->m_TopHeight = sec->ceilingplane.PointToDist (spot, targheight);
		ceiling->m_Direction = 1;
		break;

	case DCeiling::ceilLowerInstant:
		targheight = sec->ceilingplane.ZatPoint (spot) - height;
		ceiling->m_BottomHeight = sec->ceilingplane.PointToDist (spot, targheight);
		ceiling->m_Direction = -1;
		ceiling->m_Speed = height;
		break;

	case DCeiling::ceilRaiseInstant:
		targheight = sec->ceilingplane.ZatPoint (spot) + height;
		ceiling->m_TopHeight = sec->ceilingplane.PointToDist (spot, targheight);
		ceiling->m_Direction = 1;
		ceiling->m_Speed = height;
		break;

	case DCeiling::ceilLowerToNearest:
		targheight = sec->FindNextLowestCeiling (&spot);
		ceiling->m_BottomHeight = sec->ceilingplane.PointToDist (spot, targheight);
		ceiling->m_Direction = -1;
		break;

	case DCeiling::ceilRaiseToNearest:
		targheight = sec->FindNextHighestCeiling (&spot);
		ceiling->m_TopHeight = sec->ceilingplane.PointToDist (spot, targheight);
		ceiling->m_Direction = 1;
		break;

	case DCeiling::ceilLowerToLowest:
		targheight = sec->FindLowestCeilingSurrounding (&spot);
		ceiling->m_BottomHeight = sec->ceilingplane.PointToDist (spot, targheight);
		ceiling->m_Direction = -1;
		break;

	case DCeiling::ceilRaiseToLowest:
		targheight = sec->FindLowestCeilingSurrounding (&spot);
		ceiling->m_TopHeight = sec->ceilingplane.PointToDist (spot, targheight);
		ceiling->m_Direction = 1;
		break;

	case DCeiling::ceilLowerToFloor:
		targheight = sec->FindHighestFloorPoint (&spot) + height;
		ceiling->m_BottomHeight = sec->ceilingplane.PointToDist (spot, targheight);
		ceiling->m_Direction = -1;
		break;

	case DCeiling::ceilRaiseToFloor:	// [RH] What's this for?
		targheight = sec->FindHighestFloorPoint (&spot) + height;
		ceiling->m_TopHeight = sec->ceilingplane.PointToDist (spot, targheight);
		ceiling->m_Direction = 1;
		break;

	case DCeiling::ceilLowerToHighest:
		targheight = sec->FindHighestCeilingSurrounding (&spot);
		ceiling->m_BottomHeight = sec->ceilingplane.PointToDist (spot, targheight);
		ceiling->m_Direction = -1;
		break;

	case DCeiling::ceilLowerByTexture:
		targheight = sec->ceilingplane.ZatPoint (spot) - sec->FindShortestUpperAround ();
		ceiling->m_BottomHeight = sec->ceilingplane.PointToDist (spot, targheight);
		ceiling->m_Direction = -1;
		break;

	case DCeiling::ceilRaiseByTexture:
		targheight = sec->ceilingplane.ZatPoint (spot) + sec->FindShortestUpperAround ();
		ceiling->m_TopHeight = sec->ceilingplane.PointToDist (spot, targheight);
		ceiling->m_Direction = 1;
		break;

	default:
		break;	// Silence GCC
	}
			
	ceiling->m_Tag = tag;
	ceiling->m_Type = type;
	ceiling->m_Crush = crush;
	ceiling->m_CrushMode = hexencrush;

	// Do not interpolate instant movement ceilings.
	// Note for ZDoomGL: Check to make sure that you update the sector
	// after the ceiling moves, because it hasn't actually moved yet.
	double movedist;

	if (ceiling->m_Direction < 0)
	{
		movedist = sec->ceilingplane.fD() - ceiling->m_BottomHeight;
	}
	else
	{
		movedist = ceiling->m_TopHeight - sec->ceilingplane.fD();
	}
	if (ceiling->m_Speed >= movedist)
	{
		ceiling->StopInterpolation(true);
		if (silent & 4) ceiling->m_Silent = 2;
	}

	// set texture/type change properties
	if (change & 3)		// if a texture change is indicated
	{
		if (change & 4)	// if a numeric model change
		{
			sector_t *modelsec;

			//jff 5/23/98 find model with floor at target height if target
			//is a floor type
			modelsec = (/*type == ceilRaiseToHighest ||*/
				   type == DCeiling::ceilRaiseToFloor ||
				   /*type == ceilLowerToHighest ||*/
				   type == DCeiling::ceilLowerToFloor) ?
				sec->FindModelFloorSector (targheight) :
				sec->FindModelCeilingSector (targheight);
			if (modelsec != NULL)
			{
				ceiling->m_Texture = modelsec->GetTexture(sector_t::ceiling);
				switch (change & 3)
				{
					case 1:		// type is zeroed
						ceiling->m_NewSpecial.Clear();
						ceiling->m_Type = DCeiling::genCeilingChg0;
						break;
					case 2:		// type is copied
						sec->GetSpecial(&ceiling->m_NewSpecial);
						ceiling->m_Type = DCeiling::genCeilingChgT;
						break;
					case 3:		// type is left alone
						ceiling->m_Type = DCeiling::genCeilingChg;
						break;
				}
			}
		}
		else if (line)	// else if a trigger model change
		{
			ceiling->m_Texture = line->frontsector->GetTexture(sector_t::ceiling);
			switch (change & 3)
			{
				case 1:		// type is zeroed
					ceiling->m_NewSpecial.Clear();
					ceiling->m_Type = DCeiling::genCeilingChg0;
					break;
				case 2:		// type is copied
					line->frontsector->GetSpecial(&ceiling->m_NewSpecial);
					ceiling->m_Type = DCeiling::genCeilingChgT;
					break;
				case 3:		// type is left alone
					ceiling->m_Type = DCeiling::genCeilingChg;
					break;
			}
		}
	}

	ceiling->PlayCeilingSound ();
	return ceiling != NULL;
}